

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O0

void duckdb::ArrowTypeExtensionSet::Initialize(DBConfig *config)

{
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> *in_RDI;
  ArrowTypeExtension *in_stack_fffffffffffff6c0;
  ArrowTypeExtension *pAVar1;
  LogicalTypeId *in_stack_fffffffffffff6e8;
  _func_void_ClientContext_ptr_Vector_ptr_Vector_ptr_unsigned_long *in_stack_fffffffffffff6f0;
  allocator *paVar2;
  _func_void_ClientContext_ptr_Vector_ptr_Vector_ptr_unsigned_long *in_stack_fffffffffffff6f8;
  LogicalTypeId *in_stack_fffffffffffff700;
  allocator *paVar3;
  LogicalTypeId *in_stack_fffffffffffff708;
  string *arrow_format;
  string *in_stack_fffffffffffff798;
  ArrowTypeExtension *in_stack_fffffffffffff7a0;
  string *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b0;
  string *in_stack_fffffffffffff7b8;
  ArrowTypeExtension *in_stack_fffffffffffff7c0;
  populate_arrow_schema_t in_stack_fffffffffffff7c8;
  string *in_stack_fffffffffffff7d0;
  string *in_stack_fffffffffffff7d8;
  ArrowTypeExtension *in_stack_fffffffffffff7e0;
  cast_arrow_duck_t in_stack_fffffffffffff7f0;
  cast_duck_arrow_t in_stack_fffffffffffff7f8;
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [80];
  ArrowTypeExtension *in_stack_fffffffffffff928;
  DBConfig *in_stack_fffffffffffff930;
  allocator local_651;
  string local_650 [215];
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [215];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [215];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [215];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [215];
  allocator local_101;
  string local_100 [55];
  undefined1 local_c9 [193];
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> *local_8;
  
  arrow_format = (string *)local_c9;
  local_8 = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(local_c9 + 1),"arrow.uuid",(allocator *)arrow_format);
  paVar2 = &local_101;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_100,"w:16",paVar2);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            (in_stack_fffffffffffff6e8);
  ArrowTypeExtension::ArrowTypeExtension
            (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,arrow_format,in_RDI);
  DBConfig::RegisterArrowExtension(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  ArrowTypeExtension::~ArrowTypeExtension(in_stack_fffffffffffff6c0);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1525ad3);
  ::std::__cxx11::string::~string(local_100);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
  ::std::__cxx11::string::~string((string *)(local_c9 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_c9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1d8,"arrow.bool8",&local_1d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_200,"c",&local_201);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&,duckdb::LogicalTypeId_const&,void(&)(duckdb::ClientContext&,duckdb::Vector&,duckdb::Vector&,unsigned_long),void(&)(duckdb::ClientContext&,duckdb::Vector&,duckdb::Vector&,unsigned_long)>
            (in_stack_fffffffffffff708,in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
             in_stack_fffffffffffff6f0);
  ArrowTypeExtension::ArrowTypeExtension
            (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,arrow_format,in_RDI);
  DBConfig::RegisterArrowExtension(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  ArrowTypeExtension::~ArrowTypeExtension(in_stack_fffffffffffff6c0);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1525c00);
  ::std::__cxx11::string::~string(local_200);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
  ::std::__cxx11::string::~string(local_1d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2d8,"DuckDB",&local_2d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_300,"hugeint",&local_301);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_328,"w:16",&local_329);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            (in_stack_fffffffffffff6e8);
  ArrowTypeExtension::ArrowTypeExtension
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
             in_stack_fffffffffffff7a8,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)in_stack_fffffffffffff7a0);
  DBConfig::RegisterArrowExtension(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  ArrowTypeExtension::~ArrowTypeExtension(in_stack_fffffffffffff6c0);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1525d53);
  ::std::__cxx11::string::~string(local_328);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
  ::std::__cxx11::string::~string(local_300);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_301);
  ::std::__cxx11::string::~string(local_2d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_400,"DuckDB",&local_401);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_428,"uhugeint",&local_429);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_450,"w:16",&local_451);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            (in_stack_fffffffffffff6e8);
  ArrowTypeExtension::ArrowTypeExtension
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
             in_stack_fffffffffffff7a8,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)in_stack_fffffffffffff7a0);
  DBConfig::RegisterArrowExtension(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  ArrowTypeExtension::~ArrowTypeExtension(in_stack_fffffffffffff6c0);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1525eb4);
  ::std::__cxx11::string::~string(local_450);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_451);
  ::std::__cxx11::string::~string(local_428);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_429);
  ::std::__cxx11::string::~string(local_400);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_401);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_528,"DuckDB",&local_529);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_550,"time_tz",&local_551);
  paVar3 = &local_579;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_578,"w:8",paVar3);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            (in_stack_fffffffffffff6e8);
  ArrowTypeExtension::ArrowTypeExtension
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
             in_stack_fffffffffffff7a8,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)in_stack_fffffffffffff7a0);
  DBConfig::RegisterArrowExtension(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  ArrowTypeExtension::~ArrowTypeExtension(in_stack_fffffffffffff6c0);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1526009);
  ::std::__cxx11::string::~string(local_578);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_579);
  ::std::__cxx11::string::~string(local_550);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_551);
  ::std::__cxx11::string::~string(local_528);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_529);
  paVar3 = &local_651;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_650,"arrow.json",paVar3);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            (in_stack_fffffffffffff6e8);
  ArrowTypeExtension::ArrowTypeExtension
            (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
             (populate_arrow_schema_t)arrow_format,(get_type_t)in_RDI,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)paVar2);
  DBConfig::RegisterArrowExtension(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  ArrowTypeExtension::~ArrowTypeExtension(in_stack_fffffffffffff6c0);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1526102);
  ::std::__cxx11::string::~string(local_650);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_651);
  paVar2 = &local_729;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_728,"DuckDB",paVar2);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_750,"bit",&local_751);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)local_8);
  pAVar1 = (ArrowTypeExtension *)0x0;
  ArrowTypeExtension::ArrowTypeExtension
            (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
             in_stack_fffffffffffff7c8,(get_type_t)in_stack_fffffffffffff7c0,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)in_stack_fffffffffffff7b8,
             in_stack_fffffffffffff7f0,in_stack_fffffffffffff7f8);
  DBConfig::RegisterArrowExtension(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  ArrowTypeExtension::~ArrowTypeExtension(pAVar1);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x152620e);
  ::std::__cxx11::string::~string(local_750);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_751);
  ::std::__cxx11::string::~string(local_728);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_729);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff7d8,"DuckDB",(allocator *)&stack0xfffffffffffff7d7);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff7b0,"varint",(allocator *)&stack0xfffffffffffff7af);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)local_8);
  pAVar1 = (ArrowTypeExtension *)0x0;
  ArrowTypeExtension::ArrowTypeExtension
            (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
             in_stack_fffffffffffff7c8,(get_type_t)in_stack_fffffffffffff7c0,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)in_stack_fffffffffffff7b8,
             in_stack_fffffffffffff7f0,in_stack_fffffffffffff7f8);
  DBConfig::RegisterArrowExtension(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  ArrowTypeExtension::~ArrowTypeExtension(pAVar1);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1526334);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffff7b0);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7af);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffff7d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7d7);
  return;
}

Assistant:

void ArrowTypeExtensionSet::Initialize(const DBConfig &config) {
	// Types that are 1:1
	config.RegisterArrowExtension({"arrow.uuid", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::UUID)});
	config.RegisterArrowExtension(
	    {"arrow.bool8", "c",
	     make_shared_ptr<ArrowTypeExtensionData>(LogicalType::BOOLEAN, LogicalType::TINYINT, ArrowBool8::ArrowToDuck,
	                                             ArrowBool8::DuckToArrow)});

	config.RegisterArrowExtension(
	    {"DuckDB", "hugeint", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::HUGEINT)});
	config.RegisterArrowExtension(
	    {"DuckDB", "uhugeint", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::UHUGEINT)});
	config.RegisterArrowExtension(
	    {"DuckDB", "time_tz", "w:8", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::TIME_TZ)});

	// Types that are 1:n
	config.RegisterArrowExtension({"arrow.json", &ArrowJson::PopulateSchema, &ArrowJson::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::VARCHAR)});

	config.RegisterArrowExtension({"DuckDB", "bit", &ArrowBit::PopulateSchema, &ArrowBit::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::BIT), nullptr, nullptr});

	config.RegisterArrowExtension({"DuckDB", "varint", &ArrowVarint::PopulateSchema, &ArrowVarint::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::VARINT), nullptr, nullptr});
}